

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JoystickImpl.cpp
# Opt level: O2

void sf::priv::JoystickImpl::initialize(void)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  
  (anonymous_namespace)::udevContext = udev_new();
  if ((anonymous_namespace)::udevContext == 0) {
    poVar2 = err();
    poVar2 = std::operator<<(poVar2,"Failed to create udev context, joystick support not available")
    ;
    std::endl<char,std::char_traits<char>>(poVar2);
    return;
  }
  (anonymous_namespace)::udevMonitor =
       udev_monitor_new_from_netlink((anonymous_namespace)::udevContext,"udev");
  if ((anonymous_namespace)::udevMonitor == 0) {
    poVar2 = err();
    poVar2 = std::operator<<(poVar2,
                             "Failed to create udev monitor, joystick connections and disconnections won\'t be notified"
                            );
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    iVar1 = udev_monitor_filter_add_match_subsystem_devtype
                      ((anonymous_namespace)::udevMonitor,"input",0);
    if (iVar1 < 0) {
      poVar2 = err();
      pcVar3 = 
      "Failed to add udev monitor filter, joystick connections and disconnections won\'t be notified: "
      ;
    }
    else {
      iVar1 = udev_monitor_enable_receiving();
      if (-1 < iVar1) goto LAB_0011f245;
      poVar2 = err();
      pcVar3 = 
      "Failed to enable udev monitor, joystick connections and disconnections won\'t be notified: ";
    }
    poVar2 = std::operator<<(poVar2,pcVar3);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    std::endl<char,std::char_traits<char>>(poVar2);
    udev_monitor_unref();
    (anonymous_namespace)::udevMonitor = 0;
  }
LAB_0011f245:
  anon_unknown.dwarf_9f7fb::updatePluggedList((udev_device *)0x0);
  return;
}

Assistant:

void JoystickImpl::initialize()
{
    udevContext = udev_new();

    if (!udevContext)
    {
        sf::err() << "Failed to create udev context, joystick support not available" << std::endl;
        return;
    }

    udevMonitor = udev_monitor_new_from_netlink(udevContext, "udev");

    if (!udevMonitor)
    {
        err() << "Failed to create udev monitor, joystick connections and disconnections won't be notified" << std::endl;
    }
    else
    {
        int error = udev_monitor_filter_add_match_subsystem_devtype(udevMonitor, "input", NULL);

        if (error < 0)
        {
            err() << "Failed to add udev monitor filter, joystick connections and disconnections won't be notified: " << error << std::endl;

            udev_monitor_unref(udevMonitor);
            udevMonitor = 0;
        }
        else
        {
            error = udev_monitor_enable_receiving(udevMonitor);

            if (error < 0)
            {
                err() << "Failed to enable udev monitor, joystick connections and disconnections won't be notified: " << error << std::endl;

                udev_monitor_unref(udevMonitor);
                udevMonitor = 0;
            }
        }
    }

    // Do an initial scan
    updatePluggedList();
}